

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_clib.c
# Opt level: O0

char * clib_check_lds(lua_State *L,char *buf)

{
  char *pcVar1;
  int iVar2;
  char *in_RSI;
  bool bVar3;
  char *e;
  char *p;
  size_t in_stack_00000030;
  char *in_stack_00000038;
  lua_State *in_stack_00000040;
  char *local_28;
  char *local_20;
  GCstr *local_8;
  
  iVar2 = strncmp(in_RSI,"GROUP",5);
  if (((iVar2 == 0) || (iVar2 = strncmp(in_RSI,"INPUT",5), iVar2 == 0)) &&
     (local_20 = strchr(in_RSI,0x28), local_20 != (char *)0x0)) {
    do {
      local_28 = local_20 + 1;
      pcVar1 = local_20 + 1;
      local_20 = local_28;
    } while (*pcVar1 == ' ');
    while( true ) {
      bVar3 = false;
      if ((*local_28 != '\0') && (bVar3 = false, *local_28 != ' ')) {
        bVar3 = *local_28 != ')';
      }
      if (!bVar3) break;
      local_28 = local_28 + 1;
    }
    local_8 = lj_str_new(in_stack_00000040,in_stack_00000038,in_stack_00000030);
    local_8 = local_8 + 1;
  }
  else {
    local_8 = (GCstr *)0x0;
  }
  return (char *)local_8;
}

Assistant:

static const char *clib_check_lds(lua_State *L, const char *buf)
{
  char *p, *e;
  if ((!strncmp(buf, "GROUP", 5) || !strncmp(buf, "INPUT", 5)) &&
      (p = strchr(buf, '('))) {
    while (*++p == ' ') ;
    for (e = p; *e && *e != ' ' && *e != ')'; e++) ;
    return strdata(lj_str_new(L, p, e-p));
  }
  return NULL;
}